

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potion.c
# Opt level: O1

void make_blinded(long xtime,boolean talk)

{
  uint uVar1;
  boolean bVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  char *line;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  char buf [256];
  char acStack_138 [264];
  
  uVar1 = u.uprops[0x1e].intrinsic;
  pcVar5 = acStack_138;
  pcVar4 = acStack_138;
  if ((u.uprops[0x1e].intrinsic != 0) ||
     (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
      (bVar7 = true, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
    if (ublindf == (obj *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = ublindf->oartifact == '\x1d';
    }
  }
  if (((xtime != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))) ||
     (bVar8 = true, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
    if (ublindf == (obj *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = ublindf->oartifact == '\x1d';
    }
  }
  if (u.usleep != 0) {
    talk = '\0';
  }
  if ((bVar8 == false) || (bVar7 != false)) {
    if ((xtime == 0) && ((u.uprops[0x1e].intrinsic != 0 && (talk != '\0')))) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          pcVar6 = "normal";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar6 = "sadder";
            }
            else {
              bVar2 = dmgtype(youmonst.data,0x24);
              pcVar6 = "normal";
              if (bVar2 == '\0') {
                pcVar6 = "sadder";
              }
            }
          }
          line = "Your vision seems to %s for a moment but is %s now.";
          pcVar5 = "brighten";
        }
        else {
          pcVar6 = body_part(1);
          strcpy(acStack_138,pcVar6);
          if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
             (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
            pcVar6 = "twitches";
          }
          else {
            pcVar5 = makeplural(acStack_138);
            pcVar6 = "twitch";
          }
          pcVar6 = pcVar6 + 2;
          line = "Your %s momentarily %s.";
        }
        pline(line,pcVar5,pcVar6);
      }
      else {
        strange_feeling((obj *)0x0,(char *)0x0);
      }
    }
  }
  else if (talk != '\0') {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
      pcVar5 = "You can see again.";
    }
    else {
      pcVar5 = "Far out!  Everything is all cosmic again!";
    }
    pline(pcVar5);
  }
  if ((bVar7 == false) || (bVar8 != false)) {
    if ((xtime != 0) && ((uVar1 == 0 && (talk != '\0')))) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
          pcVar5 = "normal";
          if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
            if (u.umonnum == u.umonster) {
              pcVar5 = "happier";
            }
            else {
              bVar2 = dmgtype(youmonst.data,0x24);
              pcVar5 = "normal";
              if (bVar2 == '\0') {
                pcVar5 = "happier";
              }
            }
          }
          pcVar6 = "Your vision seems to %s for a moment but is %s now.";
          pcVar4 = "dim";
        }
        else {
          pcVar5 = body_part(1);
          strcpy(acStack_138,pcVar5);
          if ((((youmonst.data)->mflags1 & 0x1000) == 0) &&
             (youmonst.data == mons + 0x1e || youmonst.data == mons + 0x17b)) {
            pcVar5 = "twitches";
          }
          else {
            pcVar4 = makeplural(acStack_138);
            pcVar5 = "twitch";
          }
          pcVar6 = "Your %s momentarily %s.";
        }
        pline(pcVar6,pcVar4,pcVar5);
      }
      else {
        strange_feeling((obj *)0x0,(char *)0x0);
      }
    }
  }
  else {
    if (talk != '\0') {
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((pcVar5 = "Oh, bummer!  Everything is dark!  Help!", u.umonnum != u.umonster &&
          (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
        pcVar5 = "A cloud of darkness falls upon you.";
      }
      pline(pcVar5);
    }
    if (uball != (obj *)0x0) {
      set_bc(0);
    }
  }
  lVar3 = 0;
  if (0 < xtime) {
    lVar3 = xtime;
  }
  if (0xfffffe < lVar3) {
    lVar3 = 0xffffff;
  }
  u.uprops[0x1e].intrinsic = (uint)lVar3 | u.uprops[0x1e].intrinsic & 0xff000000;
  if (bVar7 != bVar8) {
    iflags.botl = '\x01';
    vision_full_recalc = '\x01';
    if ((((((youmonst.data == mons + 0x32 ||
            (youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e)) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) &&
           u.uprops[0x19].blocked == 0) || (u.uprops[0x40].intrinsic != 0)) ||
        (u.uprops[0x40].extrinsic != 0)) || (((youmonst.data)->mflags3 & 0x100) != 0)) {
      see_monsters();
    }
  }
  return;
}

Assistant:

void make_blinded(long xtime, boolean talk)
{
	long old = Blinded;
	boolean u_could_see, can_see_now;
	int eyecnt;
	char buf[BUFSZ];

	/* we need to probe ahead in case the Eyes of the Overworld
	   are or will be overriding blindness */
	u_could_see = !Blind;
	Blinded = xtime ? 1L : 0L;
	can_see_now = !Blind;
	Blinded = old;		/* restore */

	if (u.usleep) talk = FALSE;

	if (can_see_now && !u_could_see) {	/* regaining sight */
	    if (talk) {
		if (Hallucination)
		    pline("Far out!  Everything is all cosmic again!");
		else
		    pline("You can see again.");
	    }
	} else if (old && !xtime) {
	    /* clearing temporary blindness without toggling blindness */
	    if (talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blindfolded) {
		    strcpy(buf, body_part(EYE));
		    eyecnt = eyecount(youmonst.data);
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "itches" : "itch");
		} else {	/* Eyes of the Overworld */
		    pline(vismsg, "brighten",
			 Hallucination ? "sadder" : "normal");
		}
	    }
	}

	if (u_could_see && !can_see_now) {	/* losing sight */
	    if (talk) {
		if (Hallucination)
		    pline("Oh, bummer!  Everything is dark!  Help!");
		else
		    pline("A cloud of darkness falls upon you.");
	    }
	    /* Before the hero goes blind, set the ball&chain variables. */
	    if (Punished) set_bc(0);
	} else if (!old && xtime) {
	    /* setting temporary blindness without toggling blindness */
	    if (talk) {
		if (!haseyes(youmonst.data)) {
		    strange_feeling(NULL, NULL);
		} else if (Blindfolded) {
		    strcpy(buf, body_part(EYE));
		    eyecnt = eyecount(youmonst.data);
		    pline(eyemsg, (eyecnt == 1) ? buf : makeplural(buf),
			 (eyecnt == 1) ? "twitches" : "twitch");
		} else {	/* Eyes of the Overworld */
		    pline(vismsg, "dim",
			 Hallucination ? "happier" : "normal");
		}
	    }
	}

	set_itimeout(&Blinded, xtime);

	if (u_could_see ^ can_see_now) {  /* one or the other but not both */
	    iflags.botl = 1;
	    vision_full_recalc = 1;	/* blindness just got toggled */
	    if (Blind_telepat || Infravision) see_monsters();
	}
}